

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_TagBox.cpp
# Opt level: O0

void __thiscall
amrex::TagBox::get_itags(TagBox *this,Vector<int,_std::allocator<int>_> *ar,Box *tilebx)

{
  long lVar1;
  int iVar2;
  int iVar3;
  Long LVar4;
  char *pcVar5;
  char *pcVar6;
  Box *in_RDX;
  long in_RDI;
  IntVect IVar7;
  int i;
  TagType *cptr;
  int j;
  int k;
  int *iptr;
  TagType *p0;
  int idim_1;
  int Ltb [3];
  Long stb;
  Long Ntb;
  Long stride [3];
  int idim;
  int Lbx [3];
  IntVect dlen;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  int iVar8;
  BaseFab<char> *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int *local_a8;
  int local_98;
  int local_94 [3];
  long local_88;
  long local_80;
  long local_78 [4];
  int local_58;
  int local_54 [3];
  int local_48 [3];
  undefined8 local_34;
  int local_2c;
  Box *local_28;
  int local_c;
  undefined8 *local_8;
  
  local_28 = in_RDX;
  IVar7 = BaseFab<char>::length
                    ((BaseFab<char> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40))
  ;
  local_48._0_8_ = IVar7.vect._0_8_;
  local_34._0_4_ = local_48[0];
  local_34._4_4_ = local_48[1];
  local_48[2] = IVar7.vect[2];
  local_2c = local_48[2];
  local_54[0] = 1;
  local_54[1] = 1;
  local_54[2] = 1;
  for (local_58 = 0; local_58 < 3; local_58 = local_58 + 1) {
    local_8 = &local_34;
    local_c = local_58;
    local_54[local_58] = *(int *)((long)local_8 + (long)local_58 * 4);
  }
  local_78[0] = 1;
  local_78[1] = (long)local_54[0];
  local_78[2] = (long)local_54[0] * (long)local_54[1];
  local_80 = 1;
  local_88 = 0;
  local_94[0] = 1;
  local_94[1] = 1;
  local_94[2] = 1;
  local_48 = IVar7.vect;
  for (local_98 = 0; local_98 < 3; local_98 = local_98 + 1) {
    iVar2 = Box::length(local_28,local_98);
    local_94[local_98] = iVar2;
    local_80 = local_94[local_98] * local_80;
    lVar1 = local_78[local_98];
    iVar2 = Box::smallEnd(local_28,local_98);
    iVar3 = Box::smallEnd((Box *)(in_RDI + 0x18),local_98);
    local_88 = lVar1 * (iVar2 - iVar3) + local_88;
  }
  LVar4 = Vector<int,_std::allocator<int>_>::size((Vector<int,_std::allocator<int>_> *)0x10c0f6e);
  if (LVar4 < local_80) {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               (size_type)in_stack_ffffffffffffff48);
  }
  pcVar5 = BaseFab<char>::dataPtr(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
  lVar1 = local_88;
  local_a8 = Vector<int,_std::allocator<int>_>::dataPtr
                       ((Vector<int,_std::allocator<int>_> *)0x10c0fae);
  for (iVar2 = 0; iVar2 < local_94[2]; iVar2 = iVar2 + 1) {
    for (iVar3 = 0; iVar3 < local_94[1]; iVar3 = iVar3 + 1) {
      pcVar6 = pcVar5 + iVar2 * local_78[2] + iVar3 * local_78[1] + lVar1;
      for (iVar8 = 0; iVar8 < local_94[0]; iVar8 = iVar8 + 1) {
        if (*pcVar6 == '\0') {
          *local_a8 = 0;
        }
        else {
          *local_a8 = (int)*pcVar6;
        }
        pcVar6 = pcVar6 + 1;
        local_a8 = local_a8 + 1;
      }
    }
  }
  return;
}

Assistant:

void
TagBox::get_itags(Vector<int>& ar, const Box& tilebx) const noexcept
{
    auto dlen = length();
    int Lbx[] = {1,1,1};
    for (int idim=0; idim<AMREX_SPACEDIM; idim++) {
        Lbx[idim] = dlen[idim];
    }

    Long stride[] = {1, Lbx[0], Long(Lbx[0])*Long(Lbx[1])};

    Long Ntb = 1, stb=0;
    int Ltb[] = {1,1,1};
    for (int idim=0; idim<AMREX_SPACEDIM; idim++) {
        Ltb[idim] = tilebx.length(idim);
        Ntb *= Ltb[idim];
        stb += stride[idim] * (tilebx.smallEnd(idim) - domain.smallEnd(idim));
    }

    if (ar.size() < Ntb) ar.resize(Ntb);

    const TagType* const p0   = dataPtr() + stb;  // +stb to the lower corner of tilebox
    int*                 iptr = ar.dataPtr();

    for (int k=0; k<Ltb[2]; k++) {
        for (int j=0; j<Ltb[1]; j++) {
            const TagType* cptr = p0 + j*stride[1] + k*stride[2];
            for (int i=0; i<Ltb[0]; i++, cptr++, iptr++) {
                if (*cptr) {
                    *iptr = *cptr;
                }
                else {
                    *iptr = TagBox::CLEAR;
                }
            }
        }
    }
}